

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_exp_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,mbedtls_mpi *N,mbedtls_mpi *_RR
                       )

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  int local_cf0;
  int local_cec;
  int local_ce8;
  undefined1 local_ce0 [4];
  int neg;
  mbedtls_mpi Apos;
  mbedtls_mpi W [128];
  mbedtls_mpi T;
  mbedtls_mpi RR;
  mbedtls_mpi_uint state;
  mbedtls_mpi_uint mm;
  mbedtls_mpi_uint ei;
  size_t nbits;
  size_t bufsize;
  size_t nblimbs;
  size_t j;
  size_t i;
  size_t one;
  size_t wsize;
  size_t wbits;
  mbedtls_mpi *pmStack_38;
  int ret;
  mbedtls_mpi *_RR_local;
  mbedtls_mpi *N_local;
  mbedtls_mpi *E_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  i = 1;
  pmStack_38 = _RR;
  _RR_local = N;
  N_local = E;
  E_local = A;
  A_local = X;
  iVar2 = mbedtls_mpi_cmp_int(N,0);
  if ((iVar2 < 0) || ((*_RR_local->p & 1) == 0)) {
    return -4;
  }
  iVar2 = mbedtls_mpi_cmp_int(N_local,0);
  if (iVar2 < 0) {
    return -4;
  }
  mpi_montg_init(&state,_RR_local);
  mbedtls_mpi_init((mbedtls_mpi *)&T.p);
  mbedtls_mpi_init((mbedtls_mpi *)&W[0x7f].p);
  mbedtls_mpi_init((mbedtls_mpi *)local_ce0);
  memset(&Apos.p,0,0xc00);
  j = mbedtls_mpi_bitlen(N_local);
  if (j < 0x2a0) {
    if (j < 0xf0) {
      if (j < 0x50) {
        local_cf0 = 1;
        if (0x17 < j) {
          local_cf0 = 3;
        }
      }
      else {
        local_cf0 = 4;
      }
      local_cec = local_cf0;
    }
    else {
      local_cec = 5;
    }
    local_ce8 = local_cec;
  }
  else {
    local_ce8 = 6;
  }
  one = (size_t)local_ce8;
  if (6 < one) {
    one = 6;
  }
  nblimbs = _RR_local->n + 1;
  wbits._4_4_ = mbedtls_mpi_grow(A_local,nblimbs);
  if (((wbits._4_4_ == 0) &&
      (wbits._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&W[0].p,nblimbs), wbits._4_4_ == 0)) &&
     (wbits._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&W[0x7f].p,nblimbs << 1), wbits._4_4_ == 0)) {
    bVar3 = E_local->s == -1;
    if (bVar3) {
      wbits._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_ce0,E_local);
      if (wbits._4_4_ != 0) goto LAB_0018dec9;
      local_ce0 = (undefined1  [4])0x1;
      E_local = (mbedtls_mpi *)local_ce0;
    }
    wbits._4_4_ = 0;
    if ((pmStack_38 == (mbedtls_mpi *)0x0) || (pmStack_38->p == (mbedtls_mpi_uint *)0x0)) {
      wbits._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&T.p,1);
      if ((wbits._4_4_ != 0) ||
         ((wbits._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)&T.p,_RR_local->n << 7),
          wbits._4_4_ != 0 ||
          (wbits._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,_RR_local),
          wbits._4_4_ != 0)))) goto LAB_0018dec9;
      if (pmStack_38 != (mbedtls_mpi *)0x0) {
        *(mbedtls_mpi_uint **)pmStack_38 = T.p;
        pmStack_38->n = RR._0_8_;
        pmStack_38->p = (mbedtls_mpi_uint *)RR.n;
      }
    }
    else {
      T.p = *(mbedtls_mpi_uint **)pmStack_38;
    }
    wbits._4_4_ = 0;
    iVar2 = mbedtls_mpi_cmp_mpi(E_local,_RR_local);
    if (iVar2 < 0) {
      wbits._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&W[0].p,E_local);
    }
    else {
      wbits._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&W[0].p,E_local,_RR_local);
    }
    if (wbits._4_4_ == 0) {
      wbits._4_4_ = 0;
      mpi_montmul((mbedtls_mpi *)&W[0].p,(mbedtls_mpi *)&T.p,_RR_local,state,
                  (mbedtls_mpi *)&W[0x7f].p);
      wbits._4_4_ = mbedtls_mpi_copy(A_local,(mbedtls_mpi *)&T.p);
      if (wbits._4_4_ == 0) {
        mpi_montred(A_local,_RR_local,state,(mbedtls_mpi *)&W[0x7f].p);
        if (1 < one) {
          nblimbs = i << ((char)one - 1U & 0x3f);
          wbits._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&W[nblimbs - 1].p,_RR_local->n + 1);
          if ((wbits._4_4_ != 0) ||
             (wbits._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&W[nblimbs - 1].p,(mbedtls_mpi *)&W[0].p
                                            ), wbits._4_4_ != 0)) goto LAB_0018dec9;
          for (j = 0; sVar1 = nblimbs, j < one - 1; j = j + 1) {
            mpi_montmul((mbedtls_mpi *)&W[nblimbs - 1].p,(mbedtls_mpi *)&W[nblimbs - 1].p,_RR_local,
                        state,(mbedtls_mpi *)&W[0x7f].p);
          }
          while (j = sVar1 + 1, j < i << ((byte)one & 0x3f)) {
            wbits._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&W[sVar1].p,_RR_local->n + 1);
            if ((wbits._4_4_ != 0) ||
               (wbits._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&W[j - 1].p,(mbedtls_mpi *)&W[j - 2].p
                                              ), wbits._4_4_ != 0)) goto LAB_0018dec9;
            mpi_montmul((mbedtls_mpi *)&W[j - 1].p,(mbedtls_mpi *)&W[0].p,_RR_local,state,
                        (mbedtls_mpi *)&W[0x7f].p);
            sVar1 = j;
          }
        }
        bufsize = N_local->n;
        nbits = 0;
        ei = 0;
        wsize = 0;
        RR.p = (mbedtls_mpi_uint *)0x0;
LAB_0018dc84:
        if (nbits == 0) {
          if (bufsize == 0) goto LAB_0018ddea;
          bufsize = bufsize - 1;
          nbits = 0x40;
        }
        nbits = nbits - 1;
        mm = N_local->p[bufsize] >> ((byte)nbits & 0x3f) & 1;
        if ((mm != 0) || (RR.p != (mbedtls_mpi_uint *)0x0)) {
          if ((mm == 0) && (RR.p == (mbedtls_mpi_uint *)0x1)) {
            mpi_montmul(A_local,A_local,_RR_local,state,(mbedtls_mpi *)&W[0x7f].p);
          }
          else {
            RR.p = (mbedtls_mpi_uint *)0x2;
            ei = ei + 1;
            wsize = mm << ((char)one - (char)ei & 0x3fU) | wsize;
            if (ei == one) {
              for (j = 0; j < one; j = j + 1) {
                mpi_montmul(A_local,A_local,_RR_local,state,(mbedtls_mpi *)&W[0x7f].p);
              }
              mpi_montmul(A_local,(mbedtls_mpi *)&W[wsize - 1].p,_RR_local,state,
                          (mbedtls_mpi *)&W[0x7f].p);
              RR.p = (mbedtls_mpi_uint *)0x1;
              ei = 0;
              wsize = 0;
            }
          }
        }
        goto LAB_0018dc84;
      }
    }
  }
LAB_0018dec9:
  for (j = i << ((char)one - 1U & 0x3f); j < i << ((byte)one & 0x3f); j = j + 1) {
    mbedtls_mpi_free((mbedtls_mpi *)&W[j - 1].p);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&W[0].p);
  mbedtls_mpi_free((mbedtls_mpi *)&W[0x7f].p);
  mbedtls_mpi_free((mbedtls_mpi *)local_ce0);
  if ((pmStack_38 == (mbedtls_mpi *)0x0) || (pmStack_38->p == (mbedtls_mpi_uint *)0x0)) {
    mbedtls_mpi_free((mbedtls_mpi *)&T.p);
  }
  return wbits._4_4_;
LAB_0018ddea:
  for (j = 0; j < ei; j = j + 1) {
    mpi_montmul(A_local,A_local,_RR_local,state,(mbedtls_mpi *)&W[0x7f].p);
    wsize = wsize << 1;
    if ((wsize & i << ((byte)one & 0x3f)) != 0) {
      mpi_montmul(A_local,(mbedtls_mpi *)&W[0].p,_RR_local,state,(mbedtls_mpi *)&W[0x7f].p);
    }
  }
  mpi_montred(A_local,_RR_local,state,(mbedtls_mpi *)&W[0x7f].p);
  if (bVar3) {
    A_local->s = -1;
    wbits._4_4_ = mbedtls_mpi_add_mpi(A_local,_RR_local,A_local);
  }
  goto LAB_0018dec9;
}

Assistant:

int mbedtls_mpi_exp_mod( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *E, const mbedtls_mpi *N, mbedtls_mpi *_RR )
{
    int ret;
    size_t wbits, wsize, one = 1;
    size_t i, j, nblimbs;
    size_t bufsize, nbits;
    mbedtls_mpi_uint ei, mm, state;
    mbedtls_mpi RR, T, W[ 2 << MBEDTLS_MPI_WINDOW_SIZE ], Apos;
    int neg;

    if( mbedtls_mpi_cmp_int( N, 0 ) < 0 || ( N->p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( E, 0 ) < 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    /*
     * Init temps and window size
     */
    mpi_montg_init( &mm, N );
    mbedtls_mpi_init( &RR ); mbedtls_mpi_init( &T );
    mbedtls_mpi_init( &Apos );
    memset( W, 0, sizeof( W ) );

    i = mbedtls_mpi_bitlen( E );

    wsize = ( i > 671 ) ? 6 : ( i > 239 ) ? 5 :
            ( i >  79 ) ? 4 : ( i >  23 ) ? 3 : 1;

    if( wsize > MBEDTLS_MPI_WINDOW_SIZE )
        wsize = MBEDTLS_MPI_WINDOW_SIZE;

    j = N->n + 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[1],  j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T, j * 2 ) );

    /*
     * Compensate for negative A (and correct at the end)
     */
    neg = ( A->s == -1 );
    if( neg )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Apos, A ) );
        Apos.s = 1;
        A = &Apos;
    }

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if( _RR == NULL || _RR->p == NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &RR, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &RR, N->n * 2 * biL ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &RR, &RR, N ) );

        if( _RR != NULL )
            memcpy( _RR, &RR, sizeof( mbedtls_mpi ) );
    }
    else
        memcpy( &RR, _RR, sizeof( mbedtls_mpi ) );

    /*
     * W[1] = A * R^2 * R^-1 mod N = A * R mod N
     */
    if( mbedtls_mpi_cmp_mpi( A, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &W[1], A, N ) );
    else
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[1], A ) );

    mpi_montmul( &W[1], &RR, N, mm, &T );

    /*
     * X = R^2 * R^-1 mod N = R mod N
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &RR ) );
    mpi_montred( X, N, mm, &T );

    if( wsize > 1 )
    {
        /*
         * W[1 << (wsize - 1)] = W[1] ^ (wsize - 1)
         */
        j =  one << ( wsize - 1 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[j], N->n + 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[j], &W[1]    ) );

        for( i = 0; i < wsize - 1; i++ )
            mpi_montmul( &W[j], &W[j], N, mm, &T );

        /*
         * W[i] = W[i - 1] * W[1]
         */
        for( i = j + 1; i < ( one << wsize ); i++ )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &W[i], N->n + 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &W[i], &W[i - 1] ) );

            mpi_montmul( &W[i], &W[1], N, mm, &T );
        }
    }

    nblimbs = E->n;
    bufsize = 0;
    nbits   = 0;
    wbits   = 0;
    state   = 0;

    while( 1 )
    {
        if( bufsize == 0 )
        {
            if( nblimbs == 0 )
                break;

            nblimbs--;

            bufsize = sizeof( mbedtls_mpi_uint ) << 3;
        }

        bufsize--;

        ei = (E->p[nblimbs] >> bufsize) & 1;

        /*
         * skip leading 0s
         */
        if( ei == 0 && state == 0 )
            continue;

        if( ei == 0 && state == 1 )
        {
            /*
             * out of window, square X
             */
            mpi_montmul( X, X, N, mm, &T );
            continue;
        }

        /*
         * add ei to current window
         */
        state = 2;

        nbits++;
        wbits |= ( ei << ( wsize - nbits ) );

        if( nbits == wsize )
        {
            /*
             * X = X^wsize R^-1 mod N
             */
            for( i = 0; i < wsize; i++ )
                mpi_montmul( X, X, N, mm, &T );

            /*
             * X = X * W[wbits] R^-1 mod N
             */
            mpi_montmul( X, &W[wbits], N, mm, &T );

            state--;
            nbits = 0;
            wbits = 0;
        }
    }

    /*
     * process the remaining bits
     */
    for( i = 0; i < nbits; i++ )
    {
        mpi_montmul( X, X, N, mm, &T );

        wbits <<= 1;

        if( ( wbits & ( one << wsize ) ) != 0 )
            mpi_montmul( X, &W[1], N, mm, &T );
    }

    /*
     * X = A^E * R * R^-1 mod N = A^E mod N
     */
    mpi_montred( X, N, mm, &T );

    if( neg )
    {
        X->s = -1;
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( X, N, X ) );
    }

cleanup:

    for( i = ( one << ( wsize - 1 ) ); i < ( one << wsize ); i++ )
        mbedtls_mpi_free( &W[i] );

    mbedtls_mpi_free( &W[1] ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &Apos );

    if( _RR == NULL || _RR->p == NULL )
        mbedtls_mpi_free( &RR );

    return( ret );
}